

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O0

int anon_unknown.dwarf_7315::RtMidi_getportname(lua_State *L)

{
  int iVar1;
  RtMidi *pRVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  string local_38 [8];
  string name;
  RtMidi *self;
  lua_State *L_local;
  
  pRVar2 = getRtMidi(L,1);
  name.field_2._8_8_ = pRVar2;
  iVar1 = luaL_optinteger(L,2,1);
  (*pRVar2->_vptr_RtMidi[3])(local_38,pRVar2,(ulong)(iVar1 - 1));
  uVar3 = std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::size();
  lua_pushlstring(L,uVar3,uVar4);
  std::__cxx11::string::~string(local_38);
  return 1;
}

Assistant:

int RtMidi_getportname(lua_State *L) {
	auto &self = getRtMidi(L, 1);
	auto name = self.getPortName(static_cast<unsigned>(luaL_optinteger(L, 2, 1)) - 1);
	lua_pushlstring(L, name.c_str(), name.size());
	return 1;
}